

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk.c
# Opt level: O0

void create(archive_entry *ae,char *msg)

{
  mode_t mVar1;
  archive *v2;
  char *pcVar2;
  undefined8 in_RSI;
  archive_entry *in_RDI;
  stat_conflict st;
  archive *ad;
  archive_entry *in_stack_ffffffffffffff48;
  archive_entry *entry;
  archive *in_stack_ffffffffffffff50;
  wchar_t in_stack_ffffffffffffff58;
  wchar_t in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  wchar_t in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  uint local_90;
  void *in_stack_ffffffffffffff80;
  
  v2 = archive_write_disk_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                   (char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  failure("%s",in_RSI);
  archive_write_header(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  assertion_equal_int(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      (char *)in_stack_ffffffffffffff50,(longlong)v2,(char *)0x1cdd8a,
                      in_stack_ffffffffffffff80);
  archive_write_finish_entry((archive *)0x1cdd97);
  assertion_equal_int(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      (char *)in_stack_ffffffffffffff50,(longlong)v2,(char *)0x1cddc9,
                      in_stack_ffffffffffffff80);
  archive_write_free((archive *)0x1cddd6);
  entry = (archive_entry *)0x0;
  assertion_equal_int(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      (char *)in_stack_ffffffffffffff50,0,(char *)0x1cde04,in_stack_ffffffffffffff80
                     );
  pcVar2 = archive_entry_pathname(entry);
  stat(pcVar2,(stat *)&stack0xffffffffffffff58);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                   (char *)in_stack_ffffffffffffff50,entry);
  failure("%s",in_RSI);
  mVar1 = archive_entry_filetype(in_RDI);
  if (mVar1 == 0x4000) {
    local_90 = local_90 & 0xfffffbff;
  }
  pcVar2 = (char *)(ulong)(local_90 & 0x3ffff);
  archive_entry_mode(in_RDI);
  assertion_equal_int(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),pcVar2,0,
                      (char *)0x1cded8,in_stack_ffffffffffffff80);
  return;
}

Assistant:

static void create(struct archive_entry *ae, const char *msg)
{
	struct archive *ad;
	struct stat st;

	/* Write the entry to disk. */
	assert((ad = archive_write_disk_new()) != NULL);
	failure("%s", msg);
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	assertEqualInt(0, archive_write_free(ad));

	/* Test the entries on disk. */
	assert(0 == stat(archive_entry_pathname(ae), &st));
	failure("%s", msg);

#if !defined(_WIN32) || defined(__CYGWIN__)
	/* When verifying a dir, ignore the S_ISGID bit, as some systems set
	 * that automatically. */
	if (archive_entry_filetype(ae) == AE_IFDIR)
		st.st_mode &= ~S_ISGID;
	assertEqualInt(st.st_mode & MODE_MASK,
	    archive_entry_mode(ae) & ~UMASK & MODE_MASK);
#endif
}